

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O1

void ywalg2(double *x,int N,int p,double *phi,double *var)

{
  ulong uVar1;
  size_t sVar2;
  bool bVar3;
  double *acov;
  double *B;
  void *__src;
  double *A;
  double *C;
  ulong uVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  double dVar10;
  double local_40;
  
  sVar2 = (long)p * 8 + 8;
  acov = (double *)malloc(sVar2);
  B = (double *)malloc(sVar2);
  sVar2 = (long)p * 8;
  __src = malloc(sVar2);
  A = (double *)malloc(sVar2);
  C = (double *)malloc(8);
  autocovar(x,N,acov,p + 1U);
  dVar10 = *acov;
  *var = dVar10;
  *acov = 1.0;
  if (0 < p) {
    uVar4 = 1;
    do {
      acov[uVar4] = acov[uVar4] / dVar10;
      uVar4 = uVar4 + 1;
    } while (p + 1U != uVar4);
  }
  dVar10 = -acov[1];
  *B = dVar10;
  if (1 < p) {
    lVar8 = 1;
    local_40 = 1.0;
    uVar4 = 0;
    pdVar9 = B;
    do {
      local_40 = (1.0 - dVar10 * dVar10) * local_40;
      pdVar5 = A;
      lVar7 = lVar8;
      do {
        *pdVar5 = acov[lVar7];
        pdVar5 = pdVar5 + 1;
        lVar6 = lVar7 + -1;
        bVar3 = 0 < lVar7;
        lVar7 = lVar6;
      } while (lVar6 != 0 && bVar3);
      uVar1 = uVar4 + 1;
      mmult(A,B,C,1,(int)uVar1,1);
      dVar10 = -(*C + acov[uVar4 + 2]) / local_40;
      lVar7 = 0;
      pdVar5 = pdVar9;
      do {
        *(double *)((long)__src + lVar7 * 8) = *pdVar5 * dVar10 + B[lVar7];
        lVar7 = lVar7 + 1;
        pdVar5 = pdVar5 + -1;
      } while (lVar8 != lVar7);
      memcpy(B,__src,uVar4 * 8 + 8);
      B[uVar1] = dVar10;
      lVar8 = lVar8 + 1;
      pdVar9 = pdVar9 + 1;
      uVar4 = uVar1;
    } while (uVar1 != p - 1);
  }
  if (0 < p) {
    uVar4 = 0;
    do {
      phi[uVar4] = -B[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)p != uVar4);
  }
  mmult(acov + 1,phi,C,1,p,1);
  *var = (1.0 - *C) * *var;
  free(acov);
  free(__src);
  free(B);
  free(A);
  free(C);
  return;
}

Assistant:

void ywalg2(double *x, int N, int p, double *phi,double *var) {
	int lag, k, j;
	double *acf, *z, *y, *temp1, *temp2;
	double a, b;
	// Same as ywalg except it also returns the variance value
	lag = p + 1;
	acf = (double*)malloc(sizeof(double)* lag);
	y = (double*)malloc(sizeof(double)* lag);
	z = (double*)malloc(sizeof(double)* p);
	temp1 = (double*)malloc(sizeof(double)* p);
	temp2 = (double*)malloc(sizeof(double)* 1);

	autocovar(x, N, acf, lag);
	*var = acf[0];
	acf[0] = 1.0;
	for (k = 1; k < lag; ++k) {
		acf[k] = acf[k] / *var;
	}
	b = acf[0];
	a = y[0] = -acf[1];

	for (k = 0; k < p - 1; ++k) {
		b = (1 - a*a) * b;
		for (j = k; j >= 0; --j) {
			temp1[k - j] = acf[j + 1];
		}
		mmult(temp1, y, temp2, 1, k + 1, 1);

		a = -(*temp2 + acf[k + 2]) / b;

		for (j = 0; j <= k; ++j) {
			z[j] = y[j] + a * y[k - j];
		}

		for (j = 0; j <= k; ++j) {
			y[j] = z[j];
		}
		y[k + 1] = a;

	}

	for (j = 0; j < p; ++j) {
		phi[j] = -1.0 * y[j];
	}
	mmult(acf + 1, phi, temp2, 1, p, 1);
	*var = *var * (1.0 - *temp2);

	free(acf);
	free(z);
	free(y);
	free(temp1);
	free(temp2);
}